

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

XMLSize_t xercesc_4_0::XMLString::replaceTokens
                    (XMLCh *errText,XMLSize_t maxChars,XMLCh *text1,XMLCh *text2,XMLCh *text3,
                    XMLCh *text4,MemoryManager *manager)

{
  XMLCh *toDelete;
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  ArrayJanitor<char16_t> janText;
  ArrayJanitor<char16_t> local_40;
  
  toDelete = replicate(errText,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,manager);
  XVar3 = 0;
  while ((XVar1 = *toDelete, XVar1 != L'\0' && (XVar3 < maxChars))) {
    toDelete = toDelete + 3;
    for (; XVar3 < maxChars; XVar3 = XVar3 + 1) {
      if (XVar1 == L'\0') goto LAB_00266530;
      if (XVar1 == L'{') goto LAB_002664bc;
      errText[XVar3] = XVar1;
      XVar1 = toDelete[-2];
      toDelete = toDelete + 1;
    }
    if (XVar1 != L'{') break;
LAB_002664bc:
    XVar1 = toDelete[-2];
    if (((XVar1 & 0xfffcU) == 0x30) && (toDelete[-1] == L'}')) {
      pXVar2 = text1;
      if (((XVar1 != L'0') && (pXVar2 = text3, XVar1 != L'2')) && (pXVar2 = text2, XVar1 != L'1')) {
        pXVar2 = text4;
      }
      if (pXVar2 == (XMLCh *)0x0) {
        pXVar2 = L"{null}";
      }
      for (; (XVar1 = *pXVar2, XVar1 != L'\0' && (XVar3 < maxChars)); XVar3 = XVar3 + 1) {
        pXVar2 = pXVar2 + 1;
        errText[XVar3] = XVar1;
      }
    }
    else {
      toDelete = toDelete + -2;
      errText[XVar3] = L'{';
      XVar3 = XVar3 + 1;
    }
  }
LAB_00266530:
  errText[XVar3] = L'\0';
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return XVar3;
}

Assistant:

XMLSize_t XMLString::replaceTokens(          XMLCh* const    errText
                                        , const XMLSize_t       maxChars
                                        , const XMLCh* const    text1
                                        , const XMLCh* const    text2
                                        , const XMLCh* const    text3
                                        , const XMLCh* const    text4
                                        , MemoryManager* const  manager)
{
    //
    //  We have to build the string back into the source string, so allocate
    //  a temp string and copy the orignal text to it. We'll then treat the
    //  incoming buffer as a target buffer. Put a janitor on it to make sure
    //  it gets cleaned up.
    //
    XMLCh* orgText = replicate(errText, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);

    XMLCh* pszSrc = orgText;
    XMLSize_t curOutInd = 0;

    while (*pszSrc && (curOutInd < maxChars))
    {
        //
        //  Loop until we see a { character. Until we do, just copy chars
        //  from src to target, being sure not to overrun the output buffer.
        //
        while ((*pszSrc != chOpenCurly) && (curOutInd < maxChars))
        {
            if (!*pszSrc)
                break;
            errText[curOutInd++] = *pszSrc++;
        }

        // If we did not find a curly, then we are done
        if (*pszSrc != chOpenCurly)
            break;

        //
        //  Probe this one to see if it matches our pattern of {x}. If not
        //  then copy over those chars and go back to the first loop.
        //
        if ((*(pszSrc+1) >= chDigit_0)
        &&  (*(pszSrc+1) <= chDigit_3)
        &&  (*(pszSrc+2) == chCloseCurly))
        {
            //
            //  Its one of our guys, so move the source pointer up past the
            //  token we are replacing. First though get out the token number
            //  character.
            //
            XMLCh tokCh = *(pszSrc+1);
            pszSrc += 3;

            // Now copy over the replacement text
            const XMLCh* repText = 0;
            if (tokCh == chDigit_0)
                repText = text1;
            else if (tokCh == chDigit_1)
                repText = text2;
            else if (tokCh == chDigit_2)
                repText = text3;
            else if (tokCh == chDigit_3)
                repText = text4;

            // If this one is null, copy over a null string
            if (!repText)
                repText = gNullStr;

            while (*repText && (curOutInd < maxChars))
                errText[curOutInd++] = *repText++;
        }
         else
        {
            // Escape the curly brace character and continue
            errText[curOutInd++] = *pszSrc++;
        }
    }

    // Copy over a null terminator
    errText[curOutInd] = 0;

    // And return the count of chars we output
    return curOutInd;
}